

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9ProcessCsv(char *zInput,int nByte,int delim,int encl,int escape,
                   _func_sxi32_char_ptr_int_void_ptr *xConsumer,void *pUserData)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  char *zIn;
  char *pcVar3;
  char *pcVar4;
  
  if (0 < nByte) {
    pcVar3 = zInput + nByte;
    do {
      in_EAX = 0;
      pcVar4 = zInput;
      do {
        iVar1 = (int)*pcVar4;
        if ((iVar1 == delim) && (in_EAX == 0)) break;
        if (iVar1 == encl) {
          in_EAX = (uint)(in_EAX == 0);
        }
        pcVar4 = pcVar4 + (ulong)(iVar1 != encl && iVar1 == escape) + 1;
      } while (pcVar4 < pcVar3);
      if (zInput < pcVar4) {
        iVar2 = (int)pcVar4 - (int)zInput;
        in_EAX = (uint)*zInput;
        iVar1 = iVar2 + -2;
        if (in_EAX != encl) {
          iVar1 = iVar2;
        }
        if ((0 < iVar1) &&
           (in_EAX = jx9CsvConsumer(zInput + (in_EAX == encl),iVar1,xConsumer), in_EAX == 0xfffffff6
           )) {
          return -10;
        }
      }
      for (; (pcVar4 < pcVar3 && (in_EAX = (uint)*pcVar4, in_EAX == delim)); pcVar4 = pcVar4 + 1) {
      }
      zInput = pcVar4;
    } while (pcVar4 < pcVar3);
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9ProcessCsv(
	const char *zInput, /* Raw input */
	int nByte,  /* Input length */
	int delim,  /* Delimiter */
	int encl,   /* Enclosure */
	int escape,  /* Escape character */
	sxi32 (*xConsumer)(const char *, int, void *), /* User callback */
	void *pUserData /* Last argument to xConsumer() */
	)
{
	const char *zEnd = &zInput[nByte];
	const char *zIn = zInput;
	const char *zPtr;
	int isEnc;
	/* Start processing */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		isEnc = 0;
		zPtr = zIn;
		/* Find the first delimiter */
		while( zIn < zEnd ){
			if( zIn[0] == delim && !isEnc){
				/* Delimiter found, break imediately */
				break;
			}else if( zIn[0] == encl ){
				/* Inside enclosure? */
				isEnc = !isEnc;
			}else if( zIn[0] == escape ){
				/* Escape sequence */
				zIn++;
			}
			/* Advance the cursor */
			zIn++;
		}
		if( zIn > zPtr ){
			int nByte = (int)(zIn-zPtr);
			sxi32 rc;
			/* Invoke the supllied callback */
			if( zPtr[0] == encl ){
				zPtr++;
				nByte-=2;
			}
			if( nByte > 0 ){
				rc = xConsumer(zPtr, nByte, pUserData);
				if( rc == SXERR_ABORT ){
					/* User callback request an operation abort */
					break;
				}
			}
		}
		/* Ignore trailing delimiter */
		while( zIn < zEnd && zIn[0] == delim ){
			zIn++;
		}
	}
	return SXRET_OK;
}